

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.cc
# Opt level: O1

void xlib::DemangleSymbol(string *symbol)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  int status;
  size_t size;
  char temp [1024];
  undefined4 local_434;
  undefined8 local_430;
  char local_428 [1032];
  
  local_430 = 0;
  local_434 = 0xfffffffc;
  memset(local_428,0,0x400);
  iVar1 = __isoc99_sscanf((symbol->_M_dataplus)._M_p,"%*[^(_](%[^ )+]",local_428);
  if (iVar1 == 1) {
    __s = (char *)__cxa_demangle(local_428,0,&local_430,&local_434);
    if (__s != (char *)0x0) {
      strlen(local_428);
      iVar1 = std::__cxx11::string::find((char *)symbol,(ulong)local_428,0);
      pcVar2 = (char *)strlen(local_428);
      std::__cxx11::string::replace((ulong)symbol,(long)iVar1,pcVar2,0x1250bf);
      strlen(__s);
      std::__cxx11::string::replace((ulong)symbol,(long)iVar1,(char *)0x0,(ulong)__s);
      free(__s);
    }
  }
  return;
}

Assistant:

void DemangleSymbol(std::string* symbol) {
    size_t size = 0;
    int status = -4;
    char temp[1024] = {'\0'};
    /*
     * ./px(_ZN11ProxyServer6UpdateEv+0x4c) [0x40d5fa]
     * ./px(_ZN11ProxyServer5ServeEv+0x75) [0x40d853]
     * ./px(main+0x105) [0x40cbf2]
     *  匹配括号中的符号调用cxa_demangle替换
     * ./px(ProxyServer::Update()+0x4c) [0x40d5fa]
     * ./px(ProxyServer::Serve()+0x75) [0x40d853]
     * ./px(main+0x105) [0x40cbf2]
     */
    if (sscanf(symbol->c_str(), "%*[^(_](%[^ )+]", temp) == 1) {
        char* demangled = abi::__cxa_demangle(temp, NULL, &size, &status);
        if (demangled != NULL) {
            int start = symbol->find(temp);
            symbol->replace(start, strlen(temp), "");
            symbol->insert(start, demangled);
            free(demangled);
        }
    }
}